

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int ARKodeSetJacTimes(void *arkode_mem,ARKLsJacTimesSetupFn jtsetup,ARKLsJacTimesVecFn jtimes)

{
  ARKRhsFn p_Var1;
  long in_RDX;
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  int retval;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  char *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (in_RDI == (ARKodeMem)0x0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x385,"ARKodeSetJacTimes",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else if (in_RDI->step_supports_implicit == 0) {
    arkProcessError(in_RDI,-0x30,0x38e,"ARKodeSetJacTimes",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                    ,"time-stepping module does not require an algebraic solver");
    local_4 = -0x30;
  }
  else {
    local_4 = arkLs_AccessLMem(in_RDI,in_stack_ffffffffffffffd0,
                               (ARKLsMem *)
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    if (local_4 == 0) {
      if (*(long *)(*(long *)(*(long *)(in_stack_ffffffffffffffd0 + 0x38) + 8) + 0x10) == 0) {
        arkProcessError(in_RDI,-3,0x39a,"ARKodeSetJacTimes",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                        ,"SUNLinearSolver object does not support user-supplied ATimes routine");
        local_4 = -3;
      }
      else {
        if (in_RDX == 0) {
          in_stack_ffffffffffffffd0[0xf0] = '\x01';
          in_stack_ffffffffffffffd0[0xf1] = '\0';
          in_stack_ffffffffffffffd0[0xf2] = '\0';
          in_stack_ffffffffffffffd0[0xf3] = '\0';
          in_stack_ffffffffffffffd0[0xf8] = '\0';
          in_stack_ffffffffffffffd0[0xf9] = '\0';
          in_stack_ffffffffffffffd0[0xfa] = '\0';
          in_stack_ffffffffffffffd0[0xfb] = '\0';
          in_stack_ffffffffffffffd0[0xfc] = '\0';
          in_stack_ffffffffffffffd0[0xfd] = '\0';
          in_stack_ffffffffffffffd0[0xfe] = '\0';
          in_stack_ffffffffffffffd0[0xff] = '\0';
          *(code **)(in_stack_ffffffffffffffd0 + 0x100) = arkLsDQJtimes;
          *(ARKodeMem *)(in_stack_ffffffffffffffd0 + 0x110) = in_RDI;
          p_Var1 = (*in_RDI->step_getimplicitrhs)(in_RDI);
          *(ARKRhsFn *)(in_stack_ffffffffffffffd0 + 0x108) = p_Var1;
          if (*(long *)(in_stack_ffffffffffffffd0 + 0x108) == 0) {
            arkProcessError(in_RDI,-3,0x3b2,"ARKodeSetJacTimes",
                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_ls.c"
                            ,"Time step module is missing implicit RHS fcn");
            return -3;
          }
        }
        else {
          in_stack_ffffffffffffffd0[0xf0] = '\0';
          in_stack_ffffffffffffffd0[0xf1] = '\0';
          in_stack_ffffffffffffffd0[0xf2] = '\0';
          in_stack_ffffffffffffffd0[0xf3] = '\0';
          *(undefined8 *)(in_stack_ffffffffffffffd0 + 0xf8) = in_RSI;
          *(long *)(in_stack_ffffffffffffffd0 + 0x100) = in_RDX;
          *(void **)(in_stack_ffffffffffffffd0 + 0x110) = in_RDI->user_data;
        }
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int ARKodeSetJacTimes(void* arkode_mem, ARKLsJacTimesSetupFn jtsetup,
                      ARKLsJacTimesVecFn jtimes)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  int retval;

  /* Return immediately if arkode_mem is NULL */
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(ark_mem, __func__, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__,
                    __FILE__, "SUNLinearSolver object does not support user-supplied ATimes routine");
    return (ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL)
  {
    arkls_mem->jtimesDQ = SUNFALSE;
    arkls_mem->jtsetup  = jtsetup;
    arkls_mem->jtimes   = jtimes;
    arkls_mem->Jt_data  = ark_mem->user_data;
  }
  else
  {
    arkls_mem->jtimesDQ = SUNTRUE;
    arkls_mem->jtsetup  = NULL;
    arkls_mem->jtimes   = arkLsDQJtimes;
    arkls_mem->Jt_data  = ark_mem;
    arkls_mem->Jt_f     = ark_mem->step_getimplicitrhs(ark_mem);

    if (arkls_mem->Jt_f == NULL)
    {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                      "Time step module is missing implicit RHS fcn");
      return (ARKLS_ILL_INPUT);
    }
  }

  return (ARKLS_SUCCESS);
}